

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O1

void __thiscall SerialAnalyzer::~SerialAnalyzer(SerialAnalyzer *this)

{
  ~SerialAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

SerialAnalyzer::~SerialAnalyzer()
{
    KillThread();
}